

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O0

int csp_zmqhub_init_filter2
              (char *ifname,char *host,uint16_t addr,uint16_t netmask,int promisc,
              csp_iface_t **return_interface,char *sec_key,uint16_t subport,uint16_t pubport)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  pthread_t *__newthread;
  pthread_t pVar4;
  char in_CL;
  ushort in_DX;
  char *in_RDI;
  int in_R8D;
  undefined8 *in_R9;
  int i;
  uint16_t hostmask;
  int intvl;
  int cnt;
  int idle;
  int keep_alive;
  char pub_key [41];
  zmq_driver_t *drv;
  pthread_attr_t attributes;
  int ret;
  char sub [100];
  char pub [100];
  int in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined2 in_stack_fffffffffffffe76;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 local_180;
  undefined1 local_17c [2];
  uint16_t port;
  char *in_stack_fffffffffffffe88;
  pthread_attr_t local_138;
  int local_fc;
  undefined1 local_f8 [40];
  undefined1 local_88 [104];
  undefined8 *local_20;
  int local_18;
  char local_14;
  ushort local_12;
  char *local_8;
  
  port = (uint16_t)((uint)_local_17c >> 0x10);
  local_20 = in_R9;
  local_18 = in_R8D;
  local_12 = in_DX;
  local_8 = in_RDI;
  local_14 = in_CL;
  csp_zmqhub_make_endpoint
            (in_stack_fffffffffffffe88,port,
             (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             CONCAT26(in_stack_fffffffffffffe76,
                      CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
  csp_zmqhub_make_endpoint
            (in_stack_fffffffffffffe88,port,
             (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             CONCAT26(in_stack_fffffffffffffe76,
                      CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
  __newthread = (pthread_t *)calloc(1,0x90);
  if (local_8 == (char *)0x0) {
    local_8 = "ZMQHUB";
  }
  strncpy((char *)(__newthread + 4),local_8,10);
  __newthread[7] = (pthread_t)(__newthread + 4);
  __newthread[9] = (pthread_t)__newthread;
  __newthread[10] = (pthread_t)csp_zmqhub_tx;
  pVar4 = zmq_ctx_new();
  __newthread[1] = pVar4;
  csp_print_func("  ZMQ init %s: addr: %u, pub(tx): [%s], sub(rx): [%s]\n",__newthread[7],
                 (ulong)local_12,local_88,local_f8);
  pVar4 = zmq_socket(__newthread[1],1);
  __newthread[2] = pVar4;
  pVar4 = zmq_socket(__newthread[1],2);
  __newthread[3] = pVar4;
  if (_i != 0) {
    zmq_curve_public(&stack0xfffffffffffffe88,_i);
    zmq_setsockopt(__newthread[2],0x32,&stack0xfffffffffffffe88,0x29);
    zmq_setsockopt(__newthread[2],0x30,&stack0xfffffffffffffe88,0x29);
    zmq_setsockopt(__newthread[2],0x31,_i,0x29);
    zmq_setsockopt(__newthread[3],0x32,&stack0xfffffffffffffe88,0x29);
    zmq_setsockopt(__newthread[3],0x30,&stack0xfffffffffffffe88,0x29);
    zmq_setsockopt(__newthread[3],0x31,_i,0x29);
  }
  _local_17c = 1;
  local_180 = 900;
  zmq_setsockopt(__newthread[2],0x22,local_17c,4);
  zmq_setsockopt(__newthread[2],0x24,&local_180,4);
  zmq_setsockopt(__newthread[2],0x23,&stack0xfffffffffffffe7c,4);
  zmq_setsockopt(__newthread[2],0x25,&stack0xfffffffffffffe78,4);
  zmq_setsockopt(__newthread[3],0x22,local_17c,4);
  zmq_setsockopt(__newthread[3],0x24,&local_180,4);
  zmq_setsockopt(__newthread[3],0x23,&stack0xfffffffffffffe7c,4);
  zmq_setsockopt(__newthread[3],0x25,&stack0xfffffffffffffe78,4);
  uVar3 = csp_id_get_host_bits();
  uVar1 = (short)(1 << ((char)uVar3 - local_14 & 0x1fU)) - 1;
  local_fc = zmq_connect(__newthread[2],local_88);
  local_fc = zmq_connect(__newthread[3],local_f8);
  if (local_18 == 0) {
    for (in_stack_fffffffffffffe70 = 0; in_stack_fffffffffffffe70 < 4;
        in_stack_fffffffffffffe70 = in_stack_fffffffffffffe70 + 1) {
      csp_zmqhub_init_filter2::filt[in_stack_fffffffffffffe70][0] =
           local_12 << 8 | (ushort)((ushort)(in_stack_fffffffffffffe70 << 0xe) | local_12) >> 8;
      uVar2 = (ushort)(in_stack_fffffffffffffe70 << 0xe) | local_12 | uVar1;
      csp_zmqhub_init_filter2::filt[in_stack_fffffffffffffe70][1] = uVar2 << 8 | uVar2 >> 8;
      csp_zmqhub_init_filter2::filt[in_stack_fffffffffffffe70][2] =
           (ushort)((ushort)(in_stack_fffffffffffffe70 << 0xe) | 0x3fff) >> 8 | 0xff00;
      local_fc = zmq_setsockopt(__newthread[3],6,
                                csp_zmqhub_init_filter2::filt + in_stack_fffffffffffffe70,2);
      local_fc = zmq_setsockopt(__newthread[3],6,(long)in_stack_fffffffffffffe70 * 6 + 0x1201c2,2);
      local_fc = zmq_setsockopt(__newthread[3],6,(long)in_stack_fffffffffffffe70 * 6 + 0x1201c4,2);
    }
  }
  else {
    local_fc = zmq_setsockopt(__newthread[3],6,0);
  }
  local_fc = pthread_attr_init(&local_138);
  local_fc = pthread_attr_setdetachstate(&local_138,1);
  local_fc = pthread_create(__newthread,&local_138,csp_zmqhub_task,__newthread);
  csp_iflist_add((csp_iface_t *)
                 CONCAT26(uVar1,CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)));
  if (local_20 != (undefined8 *)0x0) {
    *local_20 = __newthread + 6;
  }
  return 0;
}

Assistant:

int csp_zmqhub_init_filter2(const char * ifname, const char * host, uint16_t addr, uint16_t netmask, int promisc, csp_iface_t ** return_interface, char * sec_key, uint16_t subport, uint16_t pubport) {
	
	char pub[100];
	csp_zmqhub_make_endpoint(host, subport, pub, sizeof(pub));

	char sub[100];
	csp_zmqhub_make_endpoint(host, pubport, sub, sizeof(sub));

	int ret;
	pthread_attr_t attributes;
	zmq_driver_t * drv = calloc(1, sizeof(*drv));
	assert(drv != NULL);

	if (ifname == NULL) {
		ifname = CSP_ZMQHUB_IF_NAME;
	}

	strncpy(drv->name, ifname, sizeof(drv->name) - 1);
	drv->iface.name = drv->name;
	drv->iface.driver_data = drv;
	drv->iface.nexthop = csp_zmqhub_tx;

	drv->context = zmq_ctx_new();
	assert(drv->context != NULL);

	csp_print("  ZMQ init %s: addr: %u, pub(tx): [%s], sub(rx): [%s]\n", drv->iface.name, addr, pub, sub);

	/* Publisher (TX) */
	drv->publisher = zmq_socket(drv->context, ZMQ_PUB);
	assert(drv->publisher != NULL);

	/* Subscriber (RX) */
	drv->subscriber = zmq_socket(drv->context, ZMQ_SUB);
	assert(drv->subscriber != NULL);

	/* If shared secret key provided */
	if (sec_key) {
		char pub_key[41];

		zmq_curve_public(pub_key, sec_key);
		/* Publisher (TX) */
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_SERVERKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_PUBLICKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_SECRETKEY, sec_key, CURVE_KEYLEN);
		/* Subscriber (RX) */
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_SERVERKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_PUBLICKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_SECRETKEY, sec_key, CURVE_KEYLEN);
	}
	int keep_alive = 1;
	/* Time in seconds a connection must be idle before keep-alive packet send*/
	int idle = 900;
	/* Maximum number of keep-alive probes to send without ack before connection closed */
	int cnt = 2;
	/* Interval in seconds between each keep-alive probe */
	int intvl = 900;
	/* Publisher (TX) */
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE, &keep_alive, sizeof(keep_alive));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_IDLE, &idle, sizeof(idle));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_CNT, &cnt, sizeof(cnt));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_INTVL, &intvl, sizeof(intvl));
	/* Subscriber (RX) */
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE, &keep_alive, sizeof(keep_alive));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_IDLE, &idle, sizeof(idle));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_CNT, &cnt, sizeof(cnt));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_INTVL, &intvl, sizeof(intvl));

	/* Generate filters */
	uint16_t hostmask = (1 << (csp_id_get_host_bits() - netmask)) - 1;
	
	/* Connect to server */
	ret = zmq_connect(drv->publisher, pub);
	assert(ret == 0);
	ret = zmq_connect(drv->subscriber, sub);
	assert(ret == 0);
	(void)ret;

	if (promisc) {

		// subscribe to all packets - no filter
		ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, NULL, 0);
		assert(ret == 0);

	} else {

		/* This needs to be static, because ZMQ does not copy the filter value to the
		 * outgoing packet for each setsockopt call */
		static uint16_t filt[4][3];

		for (int i = 0; i < 4; i++) {
			//int i = CSP_PRIO_NORM;
			filt[i][0] = __builtin_bswap16((i << 14) | addr);
			filt[i][1] = __builtin_bswap16((i << 14) | addr | hostmask);
			filt[i][2] = __builtin_bswap16((i << 14) | 16383);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][0], 2);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][1], 2);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][2], 2);
		}

	} 


	/* Start RX thread */
	ret = pthread_attr_init(&attributes);
	assert(ret == 0);
	ret = pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
	assert(ret == 0);
	ret = pthread_create(&drv->rx_thread, &attributes, csp_zmqhub_task, drv);
	assert(ret == 0);

	/* Register interface */
	csp_iflist_add(&drv->iface);

	if (return_interface) {
		*return_interface = &drv->iface;
	}

	return CSP_ERR_NONE;
}